

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

void __thiscall ipx::Basis::SolveForUpdate(Basis *this,Int j)

{
  int iVar1;
  int iVar2;
  Model *pMVar3;
  pointer piVar4;
  int iVar5;
  Int p;
  long lVar6;
  double dVar7;
  Timer timer;
  Timer local_20;
  
  iVar1 = this->model_->num_rows_;
  lVar6 = (long)j;
  iVar2 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6];
  iVar5 = 0;
  if (iVar1 <= iVar2) {
    iVar5 = iVar1;
  }
  p = -1;
  if (-1 < iVar2) {
    p = iVar2 - iVar5;
  }
  Timer::Timer(&local_20);
  if (p < 0) {
    pMVar3 = this->model_;
    piVar4 = (pMVar3->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[lVar6];
    LuUpdate::FtranForUpdate
              ((this->lu_)._M_t.
               super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
               super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
               super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,piVar4[lVar6 + 1] - iVar1,
               (pMVar3->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar1,
               (pMVar3->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar1);
    lVar6 = 0x68;
  }
  else {
    LuUpdate::BtranForUpdate
              ((this->lu_)._M_t.
               super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
               super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
               super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,p);
    lVar6 = 0x70;
  }
  dVar7 = Timer::Elapsed(&local_20);
  *(double *)((long)&this->control_ + lVar6) = dVar7 + *(double *)((long)&this->control_ + lVar6);
  return;
}

Assistant:

void Basis::SolveForUpdate(Int j) {
    const Int p = PositionOf(j);
    Timer timer;
    if (p < 0) {
        const SparseMatrix& AI = model_.AI();
        Int begin = AI.begin(j);
        Int end = AI.end(j);
        Int nz = end-begin;
        const Int* bi = AI.rowidx() + begin;
        const double* bx = AI.values() + begin;
        lu_->FtranForUpdate(nz, bi, bx);
        time_ftran_ += timer.Elapsed();
    }
    else {
        lu_->BtranForUpdate(p);
        time_btran_ += timer.Elapsed();
    }
}